

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void pnga_norm1(Integer g_a,double *nm)

{
  float fVar1;
  double dVar2;
  float fVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  double dVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  double dVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  uint uVar22;
  ulong uVar23;
  float fVar24;
  float fsum;
  int isum;
  Integer type;
  char *ptr;
  double dsum;
  long lsum;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  double dval;
  Integer ndim;
  Integer dims [7];
  _iterator_hdl hdl;
  long local_428;
  double *local_418;
  double *local_410;
  undefined1 local_400 [8];
  double *local_3f8;
  double *local_3f0;
  Integer local_3e8;
  double local_3e0;
  double *local_3d8;
  double local_3d0;
  double local_3c8;
  long local_3c0;
  double local_3b8 [2];
  long local_3a8;
  double *local_3a0;
  long local_398;
  long local_390;
  long local_380;
  double local_378;
  long local_370;
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_3e8 = 0;
  local_3f8 = nm;
  pnga_nodeid();
  pnga_nnodes();
  iVar4 = _ga_sync_end;
  local_400._4_4_ = 0;
  local_3c8 = 0.0;
  local_3d0 = 0.0;
  local_400._0_4_ = 0.0;
  local_3d8 = (double *)0x0;
  local_3b8[0] = 0.0;
  local_3b8[1] = 0.0;
  local_3e0 = 0.0;
  _ga_sync_end = 1;
  bVar21 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  if (bVar21) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_norm1_");
  pnga_inquire(g_a,&local_3e8,&local_370,local_368);
  if (local_370 - 3U < 0xfffffffffffffffe) {
    pnga_error("ga_norm1: wrong dimension",local_370);
  }
  switch(local_3e8) {
  case 0x3e9:
    local_410 = (double *)(local_400 + 4);
    break;
  case 0x3ea:
    local_410 = &local_3c8;
    break;
  case 0x3eb:
    local_410 = (double *)local_400;
    break;
  case 0x3ec:
    local_410 = &local_3d0;
    break;
  default:
    pnga_error("ga_norm1_: wrong data type:",local_3e8);
    local_410 = (double *)0x0;
    break;
  case 0x3ee:
    local_410 = &local_3e0;
    break;
  case 0x3ef:
    local_410 = local_3b8;
  }
  pnga_local_iterator_init(g_a,&local_330);
  while (iVar6 = pnga_local_iterator_next
                           (&local_330,&local_398,&local_3a8,(char **)&local_3d8,&local_3c0),
        lVar8 = local_370, lVar5 = local_3c0, local_418 = local_3d8, iVar6 != 0) {
    lVar20 = local_3e8 + -0x3e9;
    local_380 = local_3e8;
    switch(lVar20) {
    case 0:
      pdVar17 = (double *)0x0;
      pdVar9 = (double *)0x0;
      pdVar13 = (double *)0x0;
      pdVar18 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar16 = local_410;
      goto LAB_0012706b;
    case 1:
      pdVar17 = (double *)0x0;
      pdVar9 = (double *)0x0;
      pdVar13 = (double *)0x0;
      pdVar18 = (double *)0x0;
      pdVar11 = local_410;
      goto LAB_00127068;
    case 2:
      pdVar17 = (double *)0x0;
      pdVar9 = (double *)0x0;
      pdVar13 = local_410;
      goto LAB_00127063;
    case 3:
      pdVar17 = (double *)0x0;
      pdVar9 = (double *)0x0;
      pdVar13 = (double *)0x0;
      pdVar18 = local_410;
      goto LAB_00127066;
    default:
      pnga_error("ga1_norm1_block: wrong data type:",local_3e8);
      pdVar17 = (double *)0x0;
      break;
    case 5:
      pdVar17 = local_410;
      break;
    case 6:
      pdVar17 = (double *)0x0;
      pdVar9 = local_410;
      goto LAB_00127060;
    }
    pdVar9 = (double *)0x0;
LAB_00127060:
    pdVar13 = (double *)0x0;
LAB_00127063:
    pdVar18 = (double *)0x0;
LAB_00127066:
    pdVar11 = (double *)0x0;
LAB_00127068:
    pdVar16 = (double *)0x0;
LAB_0012706b:
    if (lVar8 < 1) {
LAB_0012709d:
      local_3f0 = pdVar13;
      pnga_error("sgai_norm1_block: wrong dimension",lVar8);
      local_428 = 0;
      lVar7 = 0;
      lVar12 = 0;
      pdVar13 = local_3f0;
      pdVar15 = (double *)0x0;
    }
    else {
      lVar7 = local_398;
      lVar12 = local_3a8;
      if (lVar8 == 2) {
        local_428 = local_390;
        pdVar15 = local_3a0;
      }
      else {
        if (lVar8 != 1) goto LAB_0012709d;
        local_428 = 1;
        pdVar15 = (double *)0x1;
      }
    }
    if (0 < (long)pdVar15 && 0 < lVar12) {
      local_3f0 = pdVar15;
      switch(lVar20) {
      case 0:
        *(float *)pdVar16 = 0.0;
        if (lVar7 <= lVar12) {
          lVar8 = 0;
          do {
            if (local_428 <= (long)pdVar15) {
              fVar24 = *(float *)pdVar16;
              pdVar9 = local_418;
              lVar20 = (long)pdVar15 + (1 - local_428);
              do {
                fVar1 = *(float *)pdVar9;
                fVar3 = (float)-(int)fVar1;
                if (0 < (int)fVar1) {
                  fVar3 = fVar1;
                }
                fVar24 = (float)((int)fVar24 + (int)fVar3);
                *(float *)pdVar16 = fVar24;
                pdVar9 = (double *)((long)pdVar9 + lVar5 * 4);
                lVar20 = lVar20 + -1;
              } while (lVar20 != 0);
            }
            lVar8 = lVar8 + 1;
            local_418 = (double *)((long)local_418 + 4);
          } while (lVar8 != (lVar12 - lVar7) + 1);
        }
        break;
      case 1:
        *pdVar11 = 0.0;
        if (lVar7 <= lVar12) {
          lVar8 = 0;
          do {
            if (local_428 <= (long)pdVar15) {
              dVar10 = *pdVar11;
              pdVar9 = local_418;
              lVar20 = (long)pdVar15 + (1 - local_428);
              do {
                dVar2 = *pdVar9;
                dVar14 = (double)-(long)dVar2;
                if (0 < (long)dVar2) {
                  dVar14 = dVar2;
                }
                dVar10 = (double)((long)dVar10 + (long)dVar14);
                *pdVar11 = dVar10;
                pdVar9 = pdVar9 + lVar5;
                lVar20 = lVar20 + -1;
              } while (lVar20 != 0);
            }
            lVar8 = lVar8 + 1;
            local_418 = local_418 + 1;
          } while (lVar8 != (lVar12 - lVar7) + 1);
        }
        break;
      case 2:
        *(float *)pdVar13 = 0.0;
        if (lVar7 <= lVar12) {
          lVar8 = 0;
          do {
            if (local_428 <= (long)pdVar15) {
              fVar24 = *(float *)pdVar13;
              pdVar9 = local_418;
              lVar20 = (long)pdVar15 + (1 - local_428);
              do {
                fVar1 = *(float *)pdVar9;
                uVar22 = -(uint)(fVar1 < -fVar1);
                fVar24 = fVar24 + (float)(~uVar22 & (uint)fVar1 | (uint)-fVar1 & uVar22);
                *(float *)pdVar13 = fVar24;
                pdVar9 = (double *)((long)pdVar9 + lVar5 * 4);
                lVar20 = lVar20 + -1;
              } while (lVar20 != 0);
            }
            lVar8 = lVar8 + 1;
            local_418 = (double *)((long)local_418 + 4);
          } while (lVar8 != (lVar12 - lVar7) + 1);
        }
        break;
      case 3:
        *pdVar18 = 0.0;
        if (lVar7 <= lVar12) {
          lVar8 = 0;
          do {
            if (local_428 <= (long)pdVar15) {
              dVar10 = *pdVar18;
              pdVar9 = local_418;
              lVar20 = (long)pdVar15 + (1 - local_428);
              do {
                dVar2 = *pdVar9;
                dVar14 = (double)((ulong)dVar2 ^ (ulong)DAT_001b03f0);
                uVar23 = -(ulong)(dVar2 < dVar14);
                dVar10 = dVar10 + (double)(~uVar23 & (ulong)dVar2 | (ulong)dVar14 & uVar23);
                *pdVar18 = dVar10;
                pdVar9 = pdVar9 + lVar5;
                lVar20 = lVar20 + -1;
              } while (lVar20 != 0);
            }
            lVar8 = lVar8 + 1;
            local_418 = local_418 + 1;
          } while (lVar8 != (lVar12 - lVar7) + 1);
        }
        break;
      default:
        pnga_error("sgai_norm1_block: wrong data type ",local_380);
        break;
      case 5:
        *pdVar17 = 0.0;
        if (lVar7 <= lVar12) {
          lVar8 = (long)pdVar15 + (1 - local_428);
          local_418 = (double *)((long)local_418 + 4);
          lVar20 = 0;
          do {
            lVar19 = lVar8;
            pdVar9 = local_418;
            if (local_428 <= (long)pdVar15) {
              do {
                fVar24 = *(float *)((long)pdVar9 + -4) * *(float *)((long)pdVar9 + -4) +
                         *(float *)pdVar9 * *(float *)pdVar9;
                if (fVar24 < 0.0) {
                  fVar24 = sqrtf(fVar24);
                  pdVar15 = local_3f0;
                }
                else {
                  fVar24 = SQRT(fVar24);
                }
                *(float *)pdVar17 = fVar24 + *(float *)pdVar17;
                lVar19 = lVar19 + -1;
                pdVar9 = (double *)((long)pdVar9 + lVar5 * 2 * 4);
              } while (lVar19 != 0);
            }
            lVar20 = lVar20 + 1;
            local_418 = (double *)((long)local_418 + 8);
          } while (lVar20 != (lVar12 - lVar7) + 1);
        }
        break;
      case 6:
        *pdVar9 = 0.0;
        pdVar9[1] = 0.0;
        if (lVar7 <= lVar12) {
          lVar8 = (long)pdVar15 + (1 - local_428);
          local_418 = local_418 + 1;
          lVar20 = 0;
          do {
            pdVar17 = local_418;
            lVar19 = lVar8;
            if (local_428 <= (long)pdVar15) {
              do {
                dVar10 = pdVar17[-1] * pdVar17[-1] + *pdVar17 * *pdVar17;
                if (dVar10 < 0.0) {
                  dVar10 = sqrt(dVar10);
                  pdVar15 = local_3f0;
                }
                else {
                  dVar10 = SQRT(dVar10);
                }
                *pdVar9 = dVar10 + *pdVar9;
                lVar19 = lVar19 + -1;
                pdVar17 = pdVar17 + lVar5 * 2;
              } while (lVar19 != 0);
            }
            lVar20 = lVar20 + 1;
            local_418 = local_418 + 2;
          } while (lVar20 != (lVar12 - lVar7) + 1);
        }
      }
    }
  }
  switch(local_3e8) {
  case 0x3e9:
    armci_msg_igop((int *)(local_400 + 4),1,"+");
    break;
  case 0x3ea:
    armci_msg_lgop((long *)&local_3c8,1,"+");
    break;
  case 0x3eb:
    armci_msg_fgop((float *)local_400,1,"+");
    break;
  case 0x3ec:
    armci_msg_dgop(&local_3d0,1,"+");
    break;
  default:
    pnga_error("ga_norm1_: wrong data type ",local_3e8);
    break;
  case 0x3ee:
    local_378 = (double)CONCAT44(local_378._4_4_,local_3e0._0_4_);
    armci_msg_fgop((float *)&local_378,1,"+");
    local_3e0 = (double)CONCAT44(local_3e0._4_4_,local_378._0_4_);
    break;
  case 0x3ef:
    local_378 = local_3b8[0];
    armci_msg_dgop(&local_378,1,"+");
    local_3b8[0] = local_378;
  }
  switch(local_3e8) {
  case 0x3e9:
    dVar10 = (double)(int)local_400._4_4_;
    break;
  case 0x3ea:
    dVar10 = (double)(long)local_3c8;
    break;
  case 0x3eb:
    dVar10 = (double)(float)local_400._0_4_;
    break;
  case 0x3ec:
    dVar10 = local_3d0;
    break;
  default:
    pnga_error("ga_norm1_:wrong data type.",local_3e8);
    goto LAB_001275fe;
  case 0x3ee:
    dVar10 = (double)local_3e0._0_4_;
    break;
  case 0x3ef:
    dVar10 = local_3b8[0];
  }
  *local_3f8 = dVar10;
LAB_001275fe:
  if (iVar4 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_norm1(Integer g_a, double *nm)
{
  Integer type=0;
  Integer me = pnga_nodeid (), i, j, nproc = pnga_nnodes();
  Integer ndim, dims[MAXDIM], lo[2], hi[2], ld; 
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  int isum = 0;
  long lsum = 0;
  double dsum = 0.0;
  float fsum = 0.0;
  double dval;
  float fval;
  DoubleComplex zsum;
  SingleComplex csum;
  char *buf = NULL;                    /*temporary buffer */
  char *ptr = NULL;
  zsum.real = 0.0;
  zsum.imag = 0.0;
  csum.real = 0.0;
  csum.imag = 0.0;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_norm1_");

  pnga_inquire (g_a, &type, &ndim, dims);


  if(ndim<=0 || ndim > 2)
    pnga_error("ga_norm1: wrong dimension", ndim);

  switch (type)
  {
    case C_INT:
      buf = (void*)(&isum);
      break;
    case C_LONG:
      buf = (void*)(&lsum);
      break;
    case C_FLOAT:
      buf = (void*)(&fsum);
      break;
    case C_DBL:
      buf = (void*)(&dsum);
      break;
    case C_DCPL:
      buf = (void*)(&zsum);
      break;
    case C_SCPL:
      buf = (void*)(&csum);
      break;
    default:
      pnga_error("ga_norm1_: wrong data type:", type);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld)) {
    sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, lo, hi);
    pnga_access_ptr(g_a, lo, hi, &ptr, &ld);
    sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
    pnga_release_update(g_a, lo, hi);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, lo, hi);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          lo[i] = index[i]*block_dims[i]+1;
          hi[i] = (index[i] + 1)*block_dims[i];
          if (hi[i] > dims[i]) hi[i] = dims[i];
          if (hi[i] < lo[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif

  /*calculate the global value buf[j] for each column */
  switch (type)
  {
    case C_INT:
      armci_msg_igop (&isum, 1, "+");
      break;
    case C_DBL:
      armci_msg_dgop (&dsum, 1, "+");
      break;
    case C_DCPL:
      dval = zsum.real;
      armci_msg_dgop (&dval, 1, "+");
      zsum.real = dval;
      break;
    case C_FLOAT:
      armci_msg_fgop (&fsum, 1, "+");
      break;
    case C_SCPL:
      fval = csum.real;
      armci_msg_fgop (&fval, 1, "+");
      csum.real = fval;
      break;
    case C_LONG:
      armci_msg_lgop (&lsum, 1, "+");
      break;
    default:
      pnga_error("ga_norm1_: wrong data type ", type);
  }

  /*evaluate the norm1 for the matrix g_a */
  switch (type)
  {
    case C_INT:
      *nm = (double)isum;
      break;
    case C_LONG:
      *nm = (double)lsum;
      break;
    case C_FLOAT:
      *nm = (double)fsum;
      break;
    case C_DBL:
      *nm = (double)dsum;
      break;
    case C_DCPL:
      *nm = (double)(zsum.real);
      break;
    case C_SCPL:
      *nm = (double)(csum.real);
      break;
    default:
      pnga_error("ga_norm1_:wrong data type.", type);
  }

  if(local_sync_end)pnga_sync();
}